

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void * __thiscall duckdb_re2::Prog::PrefixAccel_ShiftDFA(Prog *this,void *data,size_t size)

{
  ulong uVar1;
  uint64_t *puVar2;
  long lVar3;
  uint64_t *puVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar1 = this->prefix_size_;
  if (size < uVar1) {
    return (void *)0x0;
  }
  if (size < 8) {
    uVar10 = 0;
  }
  else {
    puVar2 = (this->field_11).prefix_dfa_;
    puVar4 = puVar2;
    uVar7 = 0;
    pbVar8 = (byte *)data;
    do {
      uVar15 = puVar2[*pbVar8] >> ((byte)uVar7 & 0x3f);
      uVar17 = puVar2[pbVar8[1]] >> ((byte)uVar15 & 0x3f);
      uVar16 = puVar2[pbVar8[2]] >> ((byte)uVar17 & 0x3f);
      uVar12 = puVar2[pbVar8[3]] >> ((byte)uVar16 & 0x3f);
      uVar14 = puVar2[pbVar8[4]] >> ((byte)uVar12 & 0x3f);
      uVar13 = puVar2[pbVar8[5]] >> ((byte)uVar14 & 0x3f);
      uVar9 = puVar2[pbVar8[6]] >> ((byte)uVar13 & 0x3f);
      uVar10 = puVar2[pbVar8[7]] >> ((byte)uVar9 & 0x3f);
      uVar6 = (uint)uVar10 & 0x3f;
      if (uVar6 == 0x36) {
        uVar10 = uVar7;
        if ((0x36U - (int)uVar15 & 0x3f) == 0) {
          pbVar5 = pbVar8 + 1;
        }
        else if ((0x36U - (int)uVar17 & 0x3f) == 0) {
          pbVar5 = pbVar8 + 2;
        }
        else if ((0x36U - (int)uVar16 & 0x3f) == 0) {
          pbVar5 = pbVar8 + 3;
        }
        else if ((0x36U - (int)uVar12 & 0x3f) == 0) {
          pbVar5 = pbVar8 + 4;
        }
        else if ((0x36U - (int)uVar14 & 0x3f) == 0) {
          pbVar5 = pbVar8 + 5;
        }
        else if ((0x36U - (int)uVar13 & 0x3f) == 0) {
          pbVar5 = pbVar8 + 6;
        }
        else {
          if ((0x36U - (int)uVar9 & 0x3f) != 0) {
            puVar4 = (uint64_t *)(pbVar8 + -uVar1 + 8);
            goto LAB_01866a9a;
          }
          pbVar5 = pbVar8 + 7;
        }
        puVar4 = (uint64_t *)(pbVar5 + -uVar1);
      }
      else {
        pbVar8 = pbVar8 + 8;
      }
LAB_01866a9a:
      if (uVar6 == 0x36) goto LAB_01866ac3;
      uVar7 = uVar10;
    } while (pbVar8 != (byte *)((size & 0xfffffffffffffff8) + (long)data));
    size = (size_t)((uint)size & 7);
    data = pbVar8;
LAB_01866ac3:
    if (uVar6 == 0x36) {
      return puVar4;
    }
  }
  sVar11 = 0;
  do {
    if (size == sVar11) {
      return (void *)0x0;
    }
    uVar10 = (this->field_11).prefix_dfa_[*(byte *)((long)data + sVar11)] >> ((byte)uVar10 & 0x3f);
    lVar3 = sVar11 + (1 - uVar1);
    sVar11 = sVar11 + 1;
  } while (((uint)uVar10 & 0x3f) != 0x36);
  return (byte *)((long)data + lVar3);
}

Assistant:

const void* Prog::PrefixAccel_ShiftDFA(const void* data, size_t size) {
  if (size < prefix_size_)
    return NULL;

  uint64_t curr = 0;

  // At the time of writing, rough benchmarks on a Broadwell machine showed
  // that this unroll factor (i.e. eight) achieves a speedup factor of two.
  if (size >= 8) {
    const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
    const uint8_t* endp = p + (size&~7);
    do {
      uint8_t b0 = p[0];
      uint8_t b1 = p[1];
      uint8_t b2 = p[2];
      uint8_t b3 = p[3];
      uint8_t b4 = p[4];
      uint8_t b5 = p[5];
      uint8_t b6 = p[6];
      uint8_t b7 = p[7];

      uint64_t next0 = prefix_dfa_[b0];
      uint64_t next1 = prefix_dfa_[b1];
      uint64_t next2 = prefix_dfa_[b2];
      uint64_t next3 = prefix_dfa_[b3];
      uint64_t next4 = prefix_dfa_[b4];
      uint64_t next5 = prefix_dfa_[b5];
      uint64_t next6 = prefix_dfa_[b6];
      uint64_t next7 = prefix_dfa_[b7];

      uint64_t curr0 = next0 >> (curr  & 63);
      uint64_t curr1 = next1 >> (curr0 & 63);
      uint64_t curr2 = next2 >> (curr1 & 63);
      uint64_t curr3 = next3 >> (curr2 & 63);
      uint64_t curr4 = next4 >> (curr3 & 63);
      uint64_t curr5 = next5 >> (curr4 & 63);
      uint64_t curr6 = next6 >> (curr5 & 63);
      uint64_t curr7 = next7 >> (curr6 & 63);

      if ((curr7 & 63) == kShiftDFAFinal * 6) {
        // At the time of writing, using the same masking subexpressions from
        // the preceding lines caused Clang to clutter the hot loop computing
        // them - even though they aren't actually needed for shifting! Hence
        // these rewritten conditions, which achieve a speedup factor of two.
        if (((curr7-curr0) & 63) == 0) return p+1-prefix_size_;
        if (((curr7-curr1) & 63) == 0) return p+2-prefix_size_;
        if (((curr7-curr2) & 63) == 0) return p+3-prefix_size_;
        if (((curr7-curr3) & 63) == 0) return p+4-prefix_size_;
        if (((curr7-curr4) & 63) == 0) return p+5-prefix_size_;
        if (((curr7-curr5) & 63) == 0) return p+6-prefix_size_;
        if (((curr7-curr6) & 63) == 0) return p+7-prefix_size_;
        if (((curr7-curr7) & 63) == 0) return p+8-prefix_size_;
      }

      curr = curr7;
      p += 8;
    } while (p != endp);
    data = p;
    size = size&7;
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* endp = p + size;
  while (p != endp) {
    uint8_t b = *p++;
    uint64_t next = prefix_dfa_[b];
    curr = next >> (curr & 63);
    if ((curr & 63) == kShiftDFAFinal * 6)
      return p-prefix_size_;
  }
  return NULL;
}